

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> * __thiscall
Catch::splitStringRef
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          Catch *this,StringRef str,char delimiter)

{
  pointer *ppSVar1;
  iterator iVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  StringRef local_40;
  
  pcVar4 = str.m_start;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pcVar4 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)0x0;
    pcVar6 = (char *)0x0;
    do {
      if (this[(long)pcVar5] == str.m_size._0_1_) {
        uVar3 = (long)pcVar5 - (long)pcVar6;
        if (1 < uVar3) {
          local_40.m_start = (char *)(this + (long)pcVar6);
          local_40.m_size = (long)pcVar4 - (long)pcVar6;
          if (pcVar4 < pcVar6 || local_40.m_size == 0) {
            local_40.m_start = "";
          }
          if (uVar3 <= local_40.m_size) {
            local_40.m_size = uVar3;
          }
          if (pcVar4 <= pcVar6) {
            local_40.m_size = 0;
          }
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
            _M_realloc_insert<Catch::StringRef>(__return_storage_ptr__,iVar2,&local_40);
          }
          else {
            (iVar2._M_current)->m_start = local_40.m_start;
            (iVar2._M_current)->m_size = local_40.m_size;
            ppSVar1 = &(__return_storage_ptr__->
                       super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
        }
        pcVar6 = pcVar5 + 1;
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar4);
  }
  local_40.m_size = (long)pcVar4 - (long)pcVar6;
  if (pcVar6 <= pcVar4 && local_40.m_size != 0) {
    local_40.m_start = (char *)(this + (long)pcVar6);
    iVar2._M_current =
         (__return_storage_ptr__->
         super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
      _M_realloc_insert<Catch::StringRef>(__return_storage_ptr__,iVar2,&local_40);
    }
    else {
      (iVar2._M_current)->m_start = local_40.m_start;
      (iVar2._M_current)->m_size = local_40.m_size;
      ppSVar1 = &(__return_storage_ptr__->
                 super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> splitStringRef( StringRef str, char delimiter ) {
        std::vector<StringRef> subStrings;
        std::size_t start = 0;
        for(std::size_t pos = 0; pos < str.size(); ++pos ) {
            if( str[pos] == delimiter ) {
                if( pos - start > 1 )
                    subStrings.push_back( str.substr( start, pos-start ) );
                start = pos+1;
            }
        }
        if( start < str.size() )
            subStrings.push_back( str.substr( start, str.size()-start ) );
        return subStrings;
    }